

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O2

int duckdb_shell_sqlite3_bind_blob
              (sqlite3_stmt *stmt,int idx,void *val,int length,_func_void_void_ptr *free_func)

{
  int iVar1;
  allocator local_12d;
  int local_12c;
  string local_128;
  LogicalType local_108;
  Value blob;
  Value local_b0;
  Value local_70;
  
  if (val == (void *)0x0) {
    iVar1 = 0x15;
  }
  else {
    local_12c = idx;
    duckdb::LogicalType::LogicalType(&local_108,SQLNULL);
    duckdb::Value::Value(&blob,&local_108);
    duckdb::LogicalType::~LogicalType(&local_108);
    if (length < 0) {
      std::__cxx11::string::string((string *)&local_128,(char *)val,&local_12d);
      duckdb::Value::BLOB(&local_70,&local_128);
      duckdb::Value::operator=(&blob,&local_70);
      duckdb::Value::~Value(&local_70);
      std::__cxx11::string::~string((string *)&local_128);
    }
    else {
      duckdb::Value::BLOB(&local_70,(const_data_ptr_t)val,(ulong)(uint)length);
      duckdb::Value::operator=(&blob,&local_70);
      duckdb::Value::~Value(&local_70);
    }
    if ((code *)0x1 < free_func + 1) {
      (*free_func)(val);
    }
    duckdb::Value::Value(&local_b0,&blob);
    iVar1 = sqlite3_internal_bind_value(stmt,local_12c,&local_b0);
    duckdb::Value::~Value(&local_b0);
    duckdb::Value::~Value(&blob);
  }
  return iVar1;
}

Assistant:

int sqlite3_bind_blob(sqlite3_stmt *stmt, int idx, const void *val, int length, void (*free_func)(void *)) {
	if (!val) {
		return SQLITE_MISUSE;
	}
	Value blob;
	if (length < 0) {
		blob = Value::BLOB(string((const char *)val));
	} else {
		blob = Value::BLOB(const_data_ptr_cast(val), length);
	}
	if (free_func && ((ptrdiff_t)free_func) != -1) {
		free_func((void *)val);
		val = nullptr;
	}
	try {
		return sqlite3_internal_bind_value(stmt, idx, blob);
	} catch (std::exception &ex) {
		return SQLITE_ERROR;
	}
}